

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O1

idx_t duckdb::QuantileOperation::FrameSize<long>(QuantileIncluded<long> *included,SubFrames *frames)

{
  pointer pFVar1;
  unsigned_long *puVar2;
  CURSOR_TYPE *pCVar3;
  FrameBounds *frame;
  pointer pFVar4;
  reference pvVar5;
  ulong uVar6;
  idx_t iVar7;
  FrameBounds *frame_1;
  ColumnDataScanState *pCVar8;
  
  if (((included->fmask->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
       (unsigned_long *)0x0) && (included->dmask->all_valid == true)) {
    pFVar4 = (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
             super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
             super__Vector_impl_data._M_start;
    pFVar1 = (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
             super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pFVar4 != pFVar1) {
      iVar7 = 0;
      do {
        iVar7 = (iVar7 + pFVar4->end) - pFVar4->start;
        pFVar4 = pFVar4 + 1;
      } while (pFVar4 != pFVar1);
      return iVar7;
    }
  }
  else {
    pFVar4 = (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
             super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
             super__Vector_impl_data._M_start;
    pFVar1 = (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
             super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pFVar4 != pFVar1) {
      iVar7 = 0;
      do {
        for (pCVar8 = (ColumnDataScanState *)pFVar4->start;
            pCVar8 < (ColumnDataScanState *)pFVar4->end;
            pCVar8 = (ColumnDataScanState *)
                     ((long)&(pCVar8->current_chunk_state).handles._M_h._M_buckets + 1)) {
          puVar2 = (included->fmask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if ((puVar2 == (unsigned_long *)0x0) ||
             ((puVar2[(ulong)pCVar8 >> 6] >> ((ulong)pCVar8 & 0x3f) & 1) != 0)) {
            pCVar3 = included->dmask;
            if (((ColumnDataScanState *)(pCVar3->scan).next_row_index <= pCVar8) ||
               (pCVar8 < (ColumnDataScanState *)(pCVar3->scan).current_row_index)) {
              duckdb::ColumnDataCollection::Seek
                        ((ulong)pCVar3->inputs,pCVar8,(DataChunk *)&pCVar3->scan);
              pvVar5 = vector<duckdb::Vector,_true>::operator[]
                                 ((vector<duckdb::Vector,_true> *)&pCVar3->page,0);
              pCVar3->data = *(long **)(pvVar5 + 0x20);
              pvVar5 = vector<duckdb::Vector,_true>::operator[]
                                 ((vector<duckdb::Vector,_true> *)&pCVar3->page,0);
              FlatVector::VerifyFlatVector(pvVar5);
              pCVar3->validity = (ValidityMask *)(pvVar5 + 0x28);
            }
            puVar2 = (pCVar3->validity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              uVar6 = 1;
            }
            else {
              uVar6 = (long)pCVar8 - (pCVar3->scan).current_row_index;
              uVar6 = (ulong)((puVar2[uVar6 >> 6 & 0x3ffffff] >> (uVar6 & 0x3f) & 1) != 0);
            }
          }
          else {
            uVar6 = 0;
          }
          iVar7 = iVar7 + uVar6;
        }
        pFVar4 = pFVar4 + 1;
      } while (pFVar4 != pFVar1);
      return iVar7;
    }
  }
  return 0;
}

Assistant:

static idx_t FrameSize(QuantileIncluded<INPUT_TYPE> &included, const SubFrames &frames) {
		//	Count the number of valid values
		idx_t n = 0;
		if (included.AllValid()) {
			for (const auto &frame : frames) {
				n += frame.end - frame.start;
			}
		} else {
			//	NULLs or FILTERed values,
			for (const auto &frame : frames) {
				for (auto i = frame.start; i < frame.end; ++i) {
					n += included(i);
				}
			}
		}

		return n;
	}